

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSnapValues.cpp
# Opt level: O0

void TTD::NSSnapValues::AssertSnapEquiv
               (ScriptFunctionScopeInfo *funcScopeInfo1,ScriptFunctionScopeInfo *funcScopeInfo2,
               TTDCompareMap *compareMap)

{
  uint local_24;
  uint32 i;
  TTDCompareMap *compareMap_local;
  ScriptFunctionScopeInfo *funcScopeInfo2_local;
  ScriptFunctionScopeInfo *funcScopeInfo1_local;
  
  TTDCompareMap::DiagnosticAssert
            (compareMap,funcScopeInfo1->ScriptContextLogId == funcScopeInfo2->ScriptContextLogId);
  TTDCompareMap::DiagnosticAssert
            (compareMap,funcScopeInfo1->ScopeCount == funcScopeInfo2->ScopeCount);
  for (local_24 = 0; local_24 < funcScopeInfo1->ScopeCount; local_24 = local_24 + 1) {
    TTDCompareMap::DiagnosticAssert
              (compareMap,
               funcScopeInfo1->ScopeArray[local_24].Tag == funcScopeInfo2->ScopeArray[local_24].Tag)
    ;
    TTDCompareMap::CheckConsistentAndAddPtrIdMapping_Scope
              (compareMap,funcScopeInfo1->ScopeArray[local_24].IDValue,
               funcScopeInfo2->ScopeArray[local_24].IDValue,local_24);
  }
  return;
}

Assistant:

void AssertSnapEquiv(const ScriptFunctionScopeInfo* funcScopeInfo1, const ScriptFunctionScopeInfo* funcScopeInfo2, TTDCompareMap& compareMap)
        {
            compareMap.DiagnosticAssert(funcScopeInfo1->ScriptContextLogId == funcScopeInfo2->ScriptContextLogId);

            compareMap.DiagnosticAssert(funcScopeInfo1->ScopeCount == funcScopeInfo2->ScopeCount);
            for(uint32 i = 0; i < funcScopeInfo1->ScopeCount; ++i)
            {
                compareMap.DiagnosticAssert(funcScopeInfo1->ScopeArray[i].Tag == funcScopeInfo2->ScopeArray[i].Tag);
                compareMap.CheckConsistentAndAddPtrIdMapping_Scope(funcScopeInfo1->ScopeArray[i].IDValue, funcScopeInfo2->ScopeArray[i].IDValue, i);
            }
        }